

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.c
# Opt level: O3

void adjust_level(player *p,_Bool verbose)

{
  uint32_t *puVar1;
  ulong uVar2;
  player_upkeep *ppVar3;
  bool bVar4;
  ushort uVar5;
  uint uVar6;
  long lVar7;
  ushort uVar8;
  uint uVar9;
  short sVar10;
  uint uVar11;
  source sVar12;
  source origin;
  source origin_00;
  source origin_01;
  source origin_02;
  source origin_03;
  char buf [80];
  
  uVar6 = p->exp;
  if ((int)uVar6 < 0) {
    p->exp = 0;
    uVar6 = 0;
  }
  uVar9 = p->max_exp;
  if ((int)uVar9 < 0) {
    p->max_exp = 0;
    uVar9 = 0;
  }
  if (99999999 < uVar6) {
    p->exp = 99999999;
    uVar6 = 99999999;
  }
  uVar11 = 99999999;
  if (uVar9 < 99999999) {
    uVar11 = uVar9;
  }
  if (99999999 < uVar9 || uVar11 < uVar6) {
    if (uVar11 < uVar6) {
      uVar11 = uVar6;
    }
    p->max_exp = uVar11;
  }
  puVar1 = &p->upkeep->redraw;
  *puVar1 = *puVar1 | 8;
  handle_stuff(p);
  uVar5 = p->lev;
  if (1 < (short)uVar5) {
    uVar8 = uVar5;
    do {
      if (player_exp[uVar8 - 2] <= p->exp) {
        uVar5 = uVar8;
        if (0x31 < uVar8) goto LAB_001c304f;
        break;
      }
      uVar5 = uVar8 - 1;
      p->lev = uVar5;
      bVar4 = 2 < (short)uVar8;
      uVar8 = uVar5;
    } while (bVar4);
  }
  do {
    if (p->exp < *(int *)(&DAT_002374dc + (long)(short)uVar5 * 4)) break;
    sVar10 = uVar5 + 1;
    p->lev = sVar10;
    if (p->max_lev <= (short)uVar5) {
      p->max_lev = sVar10;
    }
    strnfmt(buf,0x50,"Reached level %d",(ulong)(uint)(int)sVar10);
    history_add(p,buf,L'\t');
    msgt(7,"Welcome to level %d.",(ulong)(uint)(int)p->lev);
    sVar12 = source_none();
    origin.which = sVar12.which;
    origin._4_4_ = 0;
    origin.what = sVar12.what;
    effect_simple(L'\x10',origin,"0",L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    sVar12 = source_none();
    origin_00.which = sVar12.which;
    origin_00._4_4_ = 0;
    origin_00.what = sVar12.what;
    effect_simple(L'\x10',origin_00,"0",L'\x01',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    sVar12 = source_none();
    origin_01.which = sVar12.which;
    origin_01._4_4_ = 0;
    origin_01.what = sVar12.what;
    effect_simple(L'\x10',origin_01,"0",L'\x02',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    sVar12 = source_none();
    origin_02.which = sVar12.which;
    origin_02._4_4_ = 0;
    origin_02.what = sVar12.what;
    effect_simple(L'\x10',origin_02,"0",L'\x03',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    sVar12 = source_none();
    origin_03.which = sVar12.which;
    origin_03._4_4_ = 0;
    origin_03.what = sVar12.what;
    effect_simple(L'\x10',origin_03,"0",L'\x04',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    uVar5 = p->lev;
  } while (p->lev < 0x32);
LAB_001c304f:
  sVar10 = p->max_lev;
  lVar7 = (long)sVar10;
  if (lVar7 < 0x32) {
    do {
      sVar10 = sVar10 + 1;
      if (p->max_exp < *(int *)(&DAT_002374dc + lVar7 * 4)) break;
      lVar7 = lVar7 + 1;
      p->max_lev = sVar10;
    } while (lVar7 != 0x32);
  }
  ppVar3 = p->upkeep;
  uVar2._0_4_ = ppVar3->update;
  uVar2._4_4_ = ppVar3->redraw;
  ppVar3->update = (int)(uVar2 | 0x1e00000015);
  ppVar3->redraw = (int)((uVar2 | 0x1e00000015) >> 0x20);
  handle_stuff(p);
  return;
}

Assistant:

static void adjust_level(struct player *p, bool verbose)
{
	if (p->exp < 0)
		p->exp = 0;

	if (p->max_exp < 0)
		p->max_exp = 0;

	if (p->exp > PY_MAX_EXP)
		p->exp = PY_MAX_EXP;

	if (p->max_exp > PY_MAX_EXP)
		p->max_exp = PY_MAX_EXP;

	if (p->exp > p->max_exp)
		p->max_exp = p->exp;

	p->upkeep->redraw |= PR_EXP;

	handle_stuff(p);

	while ((p->lev > 1) && (p->exp < player_exp[p->lev - 2])) {
		p->lev--;
	}

	while ((p->lev < PY_MAX_LEVEL) && (p->exp >= player_exp[p->lev - 1])) {
		char buf[80];

		p->lev++;

		/* Save the highest level */
		if (p->lev > p->max_lev)
			p->max_lev = p->lev;

		if (verbose) {
			/* Log level updates */
			strnfmt(buf, sizeof(buf), "Reached level %d", p->lev);
			history_add(p, buf, HIST_GAIN_LEVEL);

			/* Message */
			msgt(MSG_LEVEL, "Welcome to level %d.",	p->lev);
		}

		effect_simple(EF_RESTORE_STAT, source_none(), "0", STAT_STR,
					  0, 0, 0, 0, NULL);
		effect_simple(EF_RESTORE_STAT, source_none(), "0", STAT_INT,
					  0, 0, 0, 0, NULL);
		effect_simple(EF_RESTORE_STAT, source_none(), "0", STAT_WIS,
					  0, 0, 0, 0, NULL);
		effect_simple(EF_RESTORE_STAT, source_none(), "0", STAT_DEX,
					  0, 0, 0, 0, NULL);
		effect_simple(EF_RESTORE_STAT, source_none(), "0", STAT_CON,
					  0, 0, 0, 0, NULL);
	}

	while ((p->max_lev < PY_MAX_LEVEL) &&
		   (p->max_exp >= player_exp[p->max_lev - 1])) {
		p->max_lev++;
	}

	p->upkeep->update |= (PU_BONUS | PU_HP | PU_SPELLS);
	p->upkeep->redraw |= (PR_LEV | PR_TITLE | PR_EXP | PR_STATS);
	handle_stuff(p);
}